

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print(json_value *value,int indent)

{
  json_value *value_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  json_value **ppjVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = 0;
  iVar5 = 0;
  if (0 < indent) {
    iVar1 = indent;
    iVar5 = indent;
  }
  while (iVar1 != 0) {
    printf("    ");
    iVar1 = iVar1 + -1;
  }
  if (value->name != (char *)0x0) {
    printf("\"%s\" = ");
  }
  switch(value->type) {
  case JSON_NULL:
    puts("null");
    return;
  case JSON_OBJECT:
  case JSON_ARRAY:
    pcVar3 = "[\n";
    if (value->type == JSON_OBJECT) {
      pcVar3 = "{\n";
    }
    printf(pcVar3);
    ppjVar4 = &value->first_child;
    while (value_00 = *ppjVar4, value_00 != (json_value *)0x0) {
      print(value_00,indent + 1);
      ppjVar4 = &value_00->next_sibling;
    }
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      printf("    ");
    }
    bVar6 = value->type == JSON_OBJECT;
    pcVar2 = "}\n";
    pcVar3 = "]\n";
    break;
  case JSON_STRING:
    printf("\"%s\"\n",(value->field_5).string_value);
    return;
  case JSON_INT:
    printf("%d\n",(ulong)(uint)(value->field_5).int_value);
    return;
  case JSON_FLOAT:
    printf("%f\n",(double)(value->field_5).float_value);
    return;
  case JSON_BOOL:
    bVar6 = (value->field_5).int_value == 0;
    pcVar2 = "false\n";
    pcVar3 = "true\n";
    break;
  default:
    return;
  }
  if (bVar6) {
    pcVar3 = pcVar2;
  }
  printf(pcVar3);
  return;
}

Assistant:

void print(json_value *value, int indent = 0)
{
	INDENT(indent);
	if (value->name) printf("\"%s\" = ", value->name);
	switch(value->type)
	{
	case JSON_NULL:
		printf("null\n");
		break;
	case JSON_OBJECT:
	case JSON_ARRAY:
		printf(value->type == JSON_OBJECT ? "{\n" : "[\n");
		for (json_value *it = value->first_child; it; it = it->next_sibling)
		{
			print(it, indent + 1);
		}
		INDENT(indent);
		printf(value->type == JSON_OBJECT ? "}\n" : "]\n");
		break;
	case JSON_STRING:
		printf("\"%s\"\n", value->string_value);
		break;
	case JSON_INT:
		printf("%d\n", value->int_value);
		break;
	case JSON_FLOAT:
		printf("%f\n", value->float_value);
		break;
	case JSON_BOOL:
		printf(value->int_value ? "true\n" : "false\n");
		break;
	}
}